

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O2

test_call_type *
make_test_all<unsigned_char,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>)>>
          (test_call_type *__return_storage_ptr__,
          function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
          *statistic,
          function<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>)>
          *prepare)

{
  anon_class_64_2_f0c82016 local_50;
  
  std::
  function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
  ::function(&local_50.statistic,statistic);
  std::
  function<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>)>
  ::function(&local_50.prepare,prepare);
  std::
  function<void(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_long)>
  ::
  function<make_test_all<unsigned_char,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>)>>(std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>)>)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_long)_1_,void>
            ((function<void(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_long)>
              *)__return_storage_ptr__,&local_50);
  make_test_all<unsigned_char,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>)>>(std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>)>)
  ::
  {lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_long)#1}
  ::~make_test_all((_lambda_std__vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const__unsigned_long__1_
                    *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

test_call_type make_test_all (UnaryFunction1 statistic, UnaryFunction2 prepare)
{
    return
        [statistic, prepare]
            (const std::vector<std::string> & algorithm_set, std::size_t attempts)
            {
                return test_all<Value>(algorithm_set, attempts, statistic, prepare);
            };
}